

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O1

void read_dmp_weight_array
               (FILE *fp,logmath_t *lmath,uint8 do_swap,int32 counts,ngram_raw_t *raw_ngrams,
               int weight_idx)

{
  uint uVar1;
  void *__ptr;
  long lVar2;
  undefined7 in_register_00000011;
  size_t sVar3;
  size_t n_elem;
  float fVar4;
  int32 k;
  uint local_3c;
  uint local_38;
  int local_34;
  
  local_38 = counts;
  local_34 = weight_idx;
  fread(&local_3c,4,1,(FILE *)fp);
  if ((int)CONCAT71(in_register_00000011,do_swap) != 0) {
    local_3c = local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
               local_3c << 0x18;
  }
  n_elem = (size_t)(int)local_3c;
  __ptr = __ckd_calloc__(n_elem,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                         ,0xd3);
  fread(__ptr,4,n_elem,(FILE *)fp);
  if (0 < (long)n_elem) {
    sVar3 = 0;
    do {
      if (do_swap != '\0') {
        uVar1 = *(uint *)((long)__ptr + sVar3 * 4);
        *(uint *)((long)__ptr + sVar3 * 4) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      }
      fVar4 = logmath_log10_to_log_float(lmath,(float64)(double)*(float *)((long)__ptr + sVar3 * 4))
      ;
      *(float *)((long)__ptr + sVar3 * 4) = fVar4;
      sVar3 = sVar3 + 1;
    } while (n_elem != sVar3);
  }
  if (0 < (int)local_38) {
    lVar2 = 0;
    do {
      if (local_34 == 0) {
        *(undefined4 *)((long)&raw_ngrams->prob + lVar2) =
             *(undefined4 *)
              ((long)__ptr + (long)(int)*(float *)((long)&raw_ngrams->prob + lVar2) * 4);
      }
      else {
        *(undefined4 *)((long)&raw_ngrams->backoff + lVar2) =
             *(undefined4 *)
              ((long)__ptr + (long)(int)*(float *)((long)&raw_ngrams->backoff + lVar2) * 4);
      }
      lVar2 = lVar2 + 0x18;
    } while ((ulong)local_38 * 0x18 != lVar2);
  }
  ckd_free(__ptr);
  return;
}

Assistant:

static void
read_dmp_weight_array(FILE * fp, logmath_t * lmath, uint8 do_swap,
                      int32 counts, ngram_raw_t * raw_ngrams,
                      int weight_idx)
{
    int32 i, k;
    dmp_weight_t *tmp_weight_arr;

    fread(&k, sizeof(k), 1, fp);
    if (do_swap)
        SWAP_INT32(&k);
    tmp_weight_arr =
        (dmp_weight_t *) ckd_calloc(k, sizeof(*tmp_weight_arr));
    fread(tmp_weight_arr, sizeof(*tmp_weight_arr), k, fp);
    for (i = 0; i < k; i++) {
        if (do_swap)
            SWAP_INT32(&tmp_weight_arr[i].l);
        /* Convert values to log. */
        tmp_weight_arr[i].f =
            logmath_log10_to_log_float(lmath, tmp_weight_arr[i].f);
    }
    /* replace indexes with real probs in raw bigrams */
    for (i = 0; i < counts; i++) {
	if (weight_idx == 0) {
	    raw_ngrams[i].prob =
                tmp_weight_arr[(int) raw_ngrams[i].prob].f;
        } else {
	    raw_ngrams[i].backoff =
                tmp_weight_arr[(int) raw_ngrams[i].backoff].f;
        }
    }
    ckd_free(tmp_weight_arr);
}